

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O0

pair<int,_std::array<int,_3UL>_> __thiscall
QPDF::processXRefW(QPDF *this,QPDFObjectHandle *dict,
                  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged
                  )

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference this_00;
  reference pvVar4;
  QPDFExc *pQVar5;
  bool local_152;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  ulong local_108;
  size_t i;
  undefined1 local_f8 [4];
  int max_bytes;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> w_vector;
  int entry_size;
  array<int,_3UL> W;
  QPDFObjectHandle local_b8;
  byte local_a1;
  QPDFObjectHandle local_a0;
  byte local_89;
  QPDFObjectHandle local_88 [2];
  allocator<char> local_61;
  string local_60 [32];
  undefined1 local_40 [8];
  QPDFObjectHandle W_obj;
  function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)> *damaged_local;
  QPDFObjectHandle *dict_local;
  QPDF *this_local;
  
  W_obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)damaged;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"/W",&local_61);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_40,(string *)dict);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  local_89 = 0;
  local_a1 = 0;
  bVar1 = false;
  bVar2 = QPDFObjectHandle::isArray((QPDFObjectHandle *)local_40);
  local_152 = false;
  if (bVar2) {
    iVar3 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_40);
    local_152 = false;
    if (2 < iVar3) {
      QPDFObjectHandle::getArrayItem(local_88,(int)local_40);
      local_89 = 1;
      bVar2 = QPDFObjectHandle::isInteger(local_88);
      local_152 = false;
      if (bVar2) {
        QPDFObjectHandle::getArrayItem(&local_a0,(int)local_40);
        local_a1 = 1;
        bVar2 = QPDFObjectHandle::isInteger(&local_a0);
        local_152 = false;
        if (bVar2) {
          QPDFObjectHandle::getArrayItem(&local_b8,(int)local_40);
          bVar1 = true;
          local_152 = QPDFObjectHandle::isInteger(&local_b8);
        }
      }
    }
  }
  if (bVar1) {
    QPDFObjectHandle::~QPDFObjectHandle(&local_b8);
  }
  if ((local_a1 & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
  }
  if ((local_89 & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(local_88);
  }
  if (((local_152 ^ 0xffU) & 1) != 0) {
    pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)(W._M_elems + 1),
               "Cross-reference stream does not have a proper /W key");
    std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
              (pQVar5,damaged,stack0xffffffffffffff30);
    __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  w_vector.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  QPDFObjectHandle::getArrayAsVector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f8,
             (QPDFObjectHandle *)local_40);
  i._4_4_ = 8;
  local_108 = 0;
  while( true ) {
    if (2 < local_108) {
      if ((int)w_vector.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
        std::pair<int,_std::array<int,_3UL>_>::pair<int_&,_std::array<int,_3UL>_&,_true>
                  ((pair<int,_std::array<int,_3UL>_> *)&this_local,
                   (int *)&w_vector.
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (array<int,_3UL> *)
                   ((long)&w_vector.
                           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                  ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f8);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
        return _this_local;
      }
      pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_138,"Cross-reference stream\'s /W indicates entry size of 0");
      std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                (pQVar5,damaged,local_138);
      __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    this_00 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::operator[]
                        ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f8,
                         local_108);
    iVar3 = QPDFObjectHandle::getIntValueAsInt(this_00);
    pvVar4 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        ((long)&w_vector.
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),local_108);
    *pvVar4 = iVar3;
    pvVar4 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        ((long)&w_vector.
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),local_108);
    if (i._4_4_ < *pvVar4) break;
    pvVar4 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        ((long)&w_vector.
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),local_108);
    if (*pvVar4 < 0) {
      pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_128,"Cross-reference stream\'s /W contains negative values");
      std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
                (pQVar5,damaged,local_128);
      __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
    }
    pvVar4 = std::array<int,_3UL>::operator[]
                       ((array<int,_3UL> *)
                        ((long)&w_vector.
                                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),local_108);
    w_vector.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         *pvVar4 + (int)w_vector.
                        super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_108 = local_108 + 1;
  }
  pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,"Cross-reference stream\'s /W contains impossibly large values");
  std::function<QPDFExc_(std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
            (pQVar5,damaged,local_118);
  __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

std::pair<int, std::array<int, 3>>
QPDF::processXRefW(QPDFObjectHandle& dict, std::function<QPDFExc(std::string_view)> damaged)
{
    auto W_obj = dict.getKey("/W");
    if (!(W_obj.isArray() && (W_obj.getArrayNItems() >= 3) && W_obj.getArrayItem(0).isInteger() &&
          W_obj.getArrayItem(1).isInteger() && W_obj.getArrayItem(2).isInteger())) {
        throw damaged("Cross-reference stream does not have a proper /W key");
    }

    std::array<int, 3> W;
    int entry_size = 0;
    auto w_vector = W_obj.getArrayAsVector();
    int max_bytes = sizeof(qpdf_offset_t);
    for (size_t i = 0; i < 3; ++i) {
        W[i] = w_vector[i].getIntValueAsInt();
        if (W[i] > max_bytes) {
            throw damaged("Cross-reference stream's /W contains impossibly large values");
        }
        if (W[i] < 0) {
            throw damaged("Cross-reference stream's /W contains negative values");
        }
        entry_size += W[i];
    }
    if (entry_size == 0) {
        throw damaged("Cross-reference stream's /W indicates entry size of 0");
    }
    return {entry_size, W};
}